

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Minisat::OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
          (OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *this,
          bool free)

{
  vec<Minisat::vec<unsigned_int>_>::clear(&this->occs,free);
  vec<char>::clear(&this->dirty,free);
  vec<int>::clear(&this->dirties,free);
  return;
}

Assistant:

void clear(bool free = true)
    {
        occs.clear(free);
        dirty.clear(free);
        dirties.clear(free);
    }